

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O2

void __thiscall
dynet::LogSoftmax::backward_dev_impl<dynet::Device_CPU>
          (LogSoftmax *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  uint uVar1;
  runtime_error *this_00;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> TVar3;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> TVar4;
  initializer_list<unsigned_int> x;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_1c8;
  StoragePointerType local_1b8;
  undefined1 local_1a8 [32];
  Dimensions DStack_188;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> *local_180;
  pointer local_178;
  array<int,_2UL> local_170;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_168;
  StoragePointerType local_158;
  array<long,_1> aStack_150;
  long local_148;
  DefaultDevice *local_138;
  _Type alStack_130;
  StoragePointerType local_128;
  _Type local_120;
  array<long,_1> aStack_118;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> *local_110;
  pointer local_108;
  Device_CPU *local_100;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> local_f8;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_e0;
  long local_d0;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> local_c8;
  Tensor local_b0;
  DefaultDevice *local_58;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> *local_50;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> local_48;
  Tensor *pTVar2;
  
  pTVar2 = *(xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((1 < (pTVar2->d).nd) && ((pTVar2->d).d[1] != 1)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"LogSoftmax::backward not yet implemented for multiple columns");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pTVar2 = (Tensor *)local_1a8;
  local_1a8._0_4_ = 1;
  x._M_len = 1;
  x._M_array = (iterator)pTVar2;
  Dim::Dim(&local_b0.d,x,(fx->d).bd);
  local_b0.v = (float *)(this->super_Node).aux_mem;
  local_b0.device = fx->device;
  local_b0.bs.super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b0.bs.super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0.bs.super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0.mem_pool = FXS;
  if ((fx->d).bd == 1) {
    TVar3 = Tensor::t<1>(fx);
    TVar4 = Tensor::t<1>(dEdf);
    local_1a8._16_8_ = TVar4.m_data;
    local_1a8._24_8_ = TVar4.m_dimensions.super_array<long,_1>._M_elems[0];
    local_1a8._0_16_ = (undefined1  [16])TVar3;
    local_1c8.m_data =
         (StoragePointerType)
         Tensor::t<0>((TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer> *)
                      &local_b0,pTVar2);
    local_138 = dev->edevice;
    alStack_130[0] = (long)&local_1c8;
    Eigen::
    TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,0,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
    ::operator=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,0,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
                 *)&local_138,
                (TensorReductionOp<Eigen::internal::SumReducer<float>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorCwiseBinaryOp<dynet::FWeightedError,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_Eigen::MakePointer>
                 *)local_1a8);
    uVar1 = (fx->d).d[0];
    local_100 = dev;
    TVar3 = Tensor::t<1>(fx);
    TVar4 = Tensor::t<1>(&local_b0);
    local_168 = Tensor::t<1>(dEdf);
    local_1a8._24_8_ = TVar4.m_data;
    DStack_188 = TVar4.m_dimensions.super_array<long,_1>._M_elems[0];
    local_180 = (TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> *)
                CONCAT44(local_180._4_4_,uVar1);
    local_1a8._0_16_ = (undefined1  [16])TVar3;
    local_1c8 = Tensor::t<1>(dEdxi);
    local_138 = local_100->edevice;
    alStack_130[0] = (long)&local_1c8;
    Eigen::
    TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
    ::operator+=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
                  *)&local_138,
                 (TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>
                  *)local_1a8);
  }
  else {
    Tensor::tb<1>((TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> *)&local_1c8,
                  fx);
    Tensor::tb<1>(&local_f8,dEdf);
    local_128 = local_1b8;
    local_138 = (DefaultDevice *)local_1c8.m_data;
    alStack_130[0] = (long)local_1c8.m_dimensions.super_array<long,_1>._M_elems[0];
    local_110 = (TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> *)
                local_f8.m_dimensions.super_array<long,_2>._M_elems[1];
    local_120[0] = (long)local_f8.m_data;
    aStack_118._M_elems[0] = (_Type)(_Type)local_f8.m_dimensions.super_array<long,_2>._M_elems[0];
    local_1a8._16_8_ = local_1b8;
    local_180 = (TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> *)
                local_f8.m_dimensions.super_array<long,_2>._M_elems[1];
    local_1a8._0_8_ = local_1c8.m_data;
    local_1a8._8_8_ = local_1c8.m_dimensions.super_array<long,_1>._M_elems[0];
    local_178 = local_108;
    local_1a8._24_8_ = local_f8.m_data;
    DStack_188.super_array<long,_1>._M_elems[0] =
         (array<long,_1>)(array<long,_1>)local_f8.m_dimensions.super_array<long,_2>._M_elems[0];
    local_170._M_elems = (_Type)((ulong)(uint)local_170._M_elems[1] << 0x20);
    local_e0 = Tensor::tb<0>(&local_b0);
    local_c8.m_dimensions.super_array<long,_2>._M_elems[0] = (long)&local_e0;
    local_c8.m_data = (StoragePointerType)dev->edevice;
    Eigen::
    TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
    ::operator=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
                 *)&local_c8,
                (TensorReductionOp<Eigen::internal::SumReducer<float>,_const_std::array<int,_1UL>,_const_Eigen::TensorCwiseBinaryOp<dynet::FWeightedError,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_Eigen::MakePointer>
                 *)local_1a8);
    uVar1 = (fx->d).d[0];
    Tensor::tb<1>(&local_f8,fx);
    local_1b8 = (StoragePointerType)local_f8.m_dimensions.super_array<long,_2>._M_elems[1];
    local_1c8.m_dimensions.super_array<long,_1>._M_elems[0] =
         (array<long,_1>)(array<long,_1>)local_f8.m_dimensions.super_array<long,_2>._M_elems[0];
    local_1c8.m_data = local_f8.m_data;
    Tensor::tb<1>(&local_c8,&local_b0);
    local_108 = (pointer)local_c8.m_dimensions.super_array<long,_2>._M_elems[1];
    aStack_118._M_elems[0] = (_Type)(_Type)local_c8.m_data;
    local_110 = (TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> *)
                local_c8.m_dimensions.super_array<long,_2>._M_elems[0];
    Tensor::tb<1>((TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> *)&local_e0,
                  dEdf);
    local_170._M_elems = (_Type)((ulong)uVar1 | 0x100000000);
    local_1a8._16_8_ = local_1b8;
    local_1a8._0_8_ = local_1c8.m_data;
    local_1a8._8_8_ = local_1c8.m_dimensions.super_array<long,_1>._M_elems[0];
    local_178 = local_108;
    DStack_188.super_array<long,_1>._M_elems[0] =
         (array<long,_1>)(array<long,_1>)aStack_118._M_elems[0];
    local_180 = local_110;
    local_158 = local_e0.m_data;
    aStack_150._M_elems[0] = (_Type)(_Type)local_e0.m_dimensions.super_array<long,_1>._M_elems[0];
    local_148 = local_d0;
    Tensor::tb<1>(&local_48,dEdxi);
    local_58 = dev->edevice;
    local_50 = &local_48;
    Eigen::
    TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
    ::operator+=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
                  *)&local_58,
                 (TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>
                  *)local_1a8);
  }
  std::vector<dynet::Tensor,_std::allocator<dynet::Tensor>_>::~vector(&local_b0.bs);
  return;
}

Assistant:

void LogSoftmax::backward_dev_impl(const MyDevice & dev,
                             const vector<const Tensor*>& xs,
                             const Tensor& fx,
                             const Tensor& dEdf,
                             unsigned i,
                             Tensor& dEdxi) const {
  if (xs[0]->d.cols() != 1) 
    throw std::runtime_error("LogSoftmax::backward not yet implemented for multiple columns");
  Tensor z(Dim({1},fx.d.bd), (float*)aux_mem, fx.device, DeviceMempool::FXS);
  if(fx.d.bd == 1) {
    z.t<0>().device(*dev.edevice) = fx.t<1>().binaryExpr(dEdf.t<1>(), FWeightedError()).sum();
    Eigen::array<int, 1> bcast; bcast[0] = fx.d.rows();
    dEdxi.t<1>().device(*dev.edevice) += fx.t<1>().exp() * -z.t<1>().broadcast(bcast) + dEdf.t<1>();
  } else {
    Eigen::array<int, 1> red_axis; red_axis[0] = 0;
    z.tb<0>().device(*dev.edevice) = (fx.tb<1>().binaryExpr(dEdf.tb<1>(), FWeightedError())).sum(red_axis);
    Eigen::array<int, 2> bcast; bcast[0] = fx.d.rows(); bcast[1] = 1;
    dEdxi.tb<1>().device(*dev.edevice) += fx.tb<1>().exp() * -z.tb<1>().broadcast(bcast) + dEdf.tb<1>();
  }
}